

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O0

void __thiscall amrex::MLCellABecLap::applyOverset(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  int iVar1;
  bool bVar2;
  type piVar3;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *osm;
  Array4<double> *rfab;
  Box *bx;
  MFIter mfi;
  int ncomp;
  MultiFab *rhs;
  size_type in_stack_fffffffffffffd58;
  MFIter *in_stack_fffffffffffffd60;
  FabArray<amrex::FArrayBox> *this_00;
  Any *in_stack_fffffffffffffd78;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> _Var4;
  undefined4 in_stack_fffffffffffffd90;
  int iVar5;
  undefined4 in_stack_fffffffffffffd94;
  int iVar6;
  int local_268;
  int local_264;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffdc0;
  undefined1 local_220 [64];
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_1e0;
  undefined1 local_1d8 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  MFIter local_168;
  int local_104;
  RefID local_100;
  DataAllocator local_e0;
  int local_d8;
  MFIter *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  void *local_b8;
  int local_b0;
  MultiArray4<const_double> local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  FabArray<amrex::FArrayBox> *local_80;
  int local_74;
  int local_70;
  int local_6c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_68;
  undefined4 local_5c;
  _Atomic_word *local_58;
  undefined4 local_4c;
  _Atomic_word *local_48;
  undefined4 local_3c;
  _Atomic_word *local_38;
  undefined4 local_2c;
  MFIter *local_28;
  undefined4 local_1c;
  MFIter *local_18;
  undefined4 local_c;
  MFIter *local_8;
  undefined1 do_tiling_;
  
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                     0x169fa23);
  if (bVar2) {
    local_100.data = (Ref *)Any::get<amrex::MultiFab>(in_stack_fffffffffffffd78);
    local_104 = (*in_RDI->_vptr_FabArrayBase[5])();
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    piVar3 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                       ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                        in_stack_fffffffffffffd60);
    do_tiling_ = (undefined1)((ulong)piVar3 >> 0x38);
    TilingIfNotGPU();
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),in_RDI,
                   (bool)do_tiling_);
    while (bVar2 = MFIter::isValid(&local_168), bVar2) {
      in_stack_fffffffffffffd60 = (MFIter *)(local_1d8 + 0x4c);
      MFIter::tilebox((MFIter *)in_stack_fffffffffffffdc0._M_head_impl);
      this_00 = (FabArray<amrex::FArrayBox> *)local_1d8;
      local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffd60;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_00,in_stack_fffffffffffffd60);
      local_1d8._64_8_ = this_00;
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x169fb4a);
      _Var4._M_head_impl = (PCData<amrex::FArrayBox> *)local_220;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)this_00,in_stack_fffffffffffffd60);
      local_d0 = (MFIter *)local_170._M_pi;
      local_8 = (MFIter *)local_170._M_pi;
      local_c = 0;
      local_c4 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                             *)&(local_170._M_pi)->_vptr__Sp_counted_base)->_M_t).
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      local_18 = (MFIter *)local_170._M_pi;
      local_1c = 1;
      iStack_c0 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                     *)&(local_170._M_pi)->_vptr__Sp_counted_base)->_M_t).
                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                          + 4);
      in_stack_fffffffffffffdc0._M_head_impl =
           (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
            &(local_170._M_pi)->_vptr__Sp_counted_base)->_M_t).
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      local_28 = (MFIter *)local_170._M_pi;
      local_2c = 2;
      local_d8 = (local_170._M_pi)->_M_use_count;
      local_a8.hp = (Array4<const_double> *)local_170._M_pi;
      local_38 = &(local_170._M_pi)->_M_weak_count;
      local_3c = 0;
      local_9c = *local_38;
      local_48 = &(local_170._M_pi)->_M_weak_count;
      local_4c = 1;
      iStack_98 = *(int *)&local_170._M_pi[1]._vptr__Sp_counted_base;
      local_b8 = *(void **)local_38;
      local_58 = &(local_170._M_pi)->_M_weak_count;
      local_5c = 2;
      local_b0 = *(int *)((long)&local_170._M_pi[1]._vptr__Sp_counted_base + 4);
      for (local_264 = 0; local_268 = local_d8, local_264 < local_104; local_264 = local_264 + 1) {
        for (; iVar6 = iStack_c0, local_268 <= local_b0; local_268 = local_268 + 1) {
          for (; iVar1 = local_c4, iVar6 <= iStack_98; iVar6 = iVar6 + 1) {
            while (iVar5 = iVar1, iVar5 <= local_9c) {
              local_74 = local_268;
              if (((_Var4._M_head_impl)->cpc->m_srcng).vect
                  [(long)(iVar5 - (_Var4._M_head_impl)->NC) +
                   (long)(iVar6 - (_Var4._M_head_impl)->DC) * (long)(_Var4._M_head_impl)->src +
                   (long)(local_268 - *(int *)&(_Var4._M_head_impl)->the_recv_data) *
                   *(long *)&(_Var4._M_head_impl)->op + -0x10] == 0) {
                local_80 = (FabArray<amrex::FArrayBox> *)local_1d8._64_8_;
                local_8c = local_268;
                local_90 = local_264;
                *(undefined8 *)
                 (*(long *)local_1d8._64_8_ +
                 ((long)(iVar5 - *(int *)(local_1d8._64_8_ + 0x20)) +
                  (long)(iVar6 - *(int *)(local_1d8._64_8_ + 0x24)) *
                  *(long *)&((BoxArray *)(local_1d8._64_8_ + 8))->m_bat +
                  (long)(local_268 - *(int *)(local_1d8._64_8_ + 0x28)) *
                  *(long *)(local_1d8._64_8_ + 0x10) +
                 (long)local_264 * *(long *)(local_1d8._64_8_ + 0x18)) * 8) = 0;
                local_88 = iVar6;
                local_84 = iVar5;
              }
              local_70 = iVar6;
              local_6c = iVar5;
              local_68._M_t.
              super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                   (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                    )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                      )_Var4._M_head_impl;
              iVar1 = iVar5 + 1;
            }
          }
        }
      }
      local_1e0._M_t.
      super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
           (tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            )(tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
              )_Var4._M_head_impl;
      local_e0.m_arena = (Arena *)in_stack_fffffffffffffdc0._M_head_impl;
      local_bc = local_d8;
      local_94 = local_b0;
      MFIter::operator++(&local_168);
    }
    MFIter::~MFIter(in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyOverset (int amrlev, Any& a_rhs) const
{
    if (m_overset_mask[amrlev][0]) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto& rhs = a_rhs.get<MultiFab>();
        const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*m_overset_mask[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rfab = rhs.array(mfi);
            Array4<int const> const& osm = m_overset_mask[amrlev][0]->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                if (osm(i,j,k) == 0) rfab(i,j,k,n) = 0.0;
            });
        }
    }
}